

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::ChangeSurfaceSizeCase::iterate(ChangeSurfaceSizeCase *this)

{
  EGLDisplay pvVar1;
  deUint32 err;
  Library *egl_00;
  UniqueSurface *pUVar2;
  EGLSurface pvVar3;
  EGLSurface read;
  UniqueContext *this_00;
  EGLContext context;
  NativeWindow *pNVar4;
  MovePtr<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_> *this_01;
  egl local_64 [8];
  Vector<int,_2> local_5c;
  Vector<int,_2> local_54;
  Vector<int,_2> local_4c;
  Vector<int,_2> local_44 [2];
  Vector<int,_2> local_30;
  IVec2 oldEglSize;
  ScopedCurrentContext currentCtx;
  Library *egl;
  ChangeSurfaceSizeCase *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  pvVar1 = (this->super_ResizeTest).m_display;
  this_01 = &(this->super_ResizeTest).m_surface;
  pUVar2 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&this_01->
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar3 = eglu::UniqueSurface::operator*(pUVar2);
  pUVar2 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&this_01->
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  read = eglu::UniqueSurface::operator*(pUVar2);
  this_00 = de::details::UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>::
            operator*(&(this->super_ResizeTest).m_context.
                       super_UniqueBase<eglu::UniqueContext,_de::DefaultDeleter<eglu::UniqueContext>_>
                     );
  context = eglu::UniqueContext::operator*(this_00);
  eglu::ScopedCurrentContext::ScopedCurrentContext
            ((ScopedCurrentContext *)&oldEglSize,egl_00,pvVar1,pvVar3,read,context);
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar2 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&this_01->
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar3 = eglu::UniqueSurface::operator*(pUVar2);
  pNVar4 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
           operator*(&(this->super_ResizeTest).m_nativeWindow.
                      super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>)
  ;
  tcu::Vector<int,_2>::Vector(local_44,&(this->super_ResizeTest).m_oldSize);
  checkSurfaceSize((egl *)&local_30,egl_00,pvVar1,pvVar3,pNVar4,local_44,
                   &(this->super_ResizeTest).m_status);
  tcu::Vector<int,_2>::Vector(&local_4c,&local_30);
  initSurface(&(this->super_ResizeTest).m_gl,&local_4c);
  tcu::Vector<int,_2>::Vector(&local_54,&(this->super_ResizeTest).m_newSize);
  ResizeTest::resize(&this->super_ResizeTest,&local_54);
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar2 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar3 = eglu::UniqueSurface::operator*(pUVar2);
  (*egl_00->_vptr_Library[0x31])(egl_00,pvVar1,pvVar3);
  err = (*egl_00->_vptr_Library[0x1f])();
  eglu::checkError(err,"eglSwapBuffers()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                   ,0x16a);
  pvVar1 = (this->super_ResizeTest).m_display;
  pUVar2 = de::details::UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>::
           operator*(&(this->super_ResizeTest).m_surface.
                      super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>
                    );
  pvVar3 = eglu::UniqueSurface::operator*(pUVar2);
  pNVar4 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
           operator*(&(this->super_ResizeTest).m_nativeWindow.
                      super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>)
  ;
  tcu::Vector<int,_2>::Vector(&local_5c,&(this->super_ResizeTest).m_newSize);
  checkSurfaceSize(local_64,egl_00,pvVar1,pvVar3,pNVar4,&local_5c,&(this->super_ResizeTest).m_status
                  );
  tcu::ResultCollector::setTestContextResult
            (&(this->super_ResizeTest).m_status,
             (this->super_ResizeTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  eglu::ScopedCurrentContext::~ScopedCurrentContext((ScopedCurrentContext *)&oldEglSize);
  return STOP;
}

Assistant:

IterateResult ChangeSurfaceSizeCase::iterate (void)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	ScopedCurrentContext	currentCtx	(egl, m_display, **m_surface, **m_surface, **m_context);
	IVec2					oldEglSize	= checkSurfaceSize(egl,
														   m_display,
														   **m_surface,
														   *m_nativeWindow,
														   m_oldSize,
														   m_status);

	initSurface(m_gl, oldEglSize);

	this->resize(m_newSize);

	egl.swapBuffers(m_display, **m_surface);
	EGLU_CHECK_MSG(egl, "eglSwapBuffers()");
	checkSurfaceSize(egl, m_display, **m_surface, *m_nativeWindow, m_newSize, m_status);

	m_status.setTestContextResult(m_testCtx);
	return STOP;
}